

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LEB128.h
# Opt level: O2

uint64_t decodeULEB128(uint8_t *p,uint *n)

{
  byte *pbVar1;
  uint64_t uVar2;
  byte bVar3;
  long lVar4;
  
  lVar4 = 0;
  uVar2 = 0;
  bVar3 = 0;
  do {
    pbVar1 = p + lVar4;
    uVar2 = uVar2 + (long)(int)((*pbVar1 & 0x7f) << (bVar3 & 0x1f));
    bVar3 = bVar3 + 7;
    lVar4 = lVar4 + 1;
  } while ((char)*pbVar1 < '\0');
  if (n != (uint *)0x0) {
    *n = (uint)lVar4;
  }
  return uVar2;
}

Assistant:

static inline uint64_t decodeULEB128(const uint8_t *p, unsigned *n)
{
	const uint8_t *orig_p = p;
	uint64_t Value = 0;
	unsigned Shift = 0;
	do {
		Value += (*p & 0x7f) << Shift;
		Shift += 7;
	} while (*p++ >= 128);
	if (n)
		*n = (unsigned)(p - orig_p);
	return Value;
}